

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::ArrayBase::insertAt(ArrayBase *this,uint32_t index,uint8_t *value)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  if (index <= this->size) {
    uVar2 = this->size + 1;
    this->size = uVar2;
    if (this->capacity < uVar2) {
      uVar4 = uVar2 >> 2;
      if (this->capacity == 0) {
        uVar4 = 0;
      }
      setArrayCapacity(this,uVar4 + uVar2);
    }
    uVar2 = this->size - 1;
    iVar3 = uVar2 - index;
    if (index <= uVar2 && iVar3 != 0) {
      uVar1 = this->elementSize;
      memmove(this->buffer + (index + 1) * uVar1,this->buffer + uVar1 * index,(ulong)(iVar3 * uVar1)
             );
    }
    memcpy(this->buffer + index * this->elementSize,value,(ulong)this->elementSize);
    return;
  }
  __assert_fail("index >= 0 && index <= size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x430,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
}

Assistant:

void insertAt(uint32_t index, const uint8_t *value)
	{
		XA_DEBUG_ASSERT(index >= 0 && index <= size);
		resize(size + 1, false);
		if (index < size - 1)
			memmove(buffer + elementSize * (index + 1), buffer + elementSize * index, elementSize * (size - 1 - index));
		memcpy(&buffer[index * elementSize], value, elementSize);
	}